

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O1

void Abc_SclManPrintGateSizes(SC_Lib *pLib,Abc_Ntk_t *p,Vec_Int_t *vGates)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  long *plVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  int Counters [64];
  double Areas [64];
  double local_350;
  uint local_338 [64];
  double local_238 [65];
  
  uVar8 = 0;
  memset(local_338,0,0x100);
  memset(local_238,0,0x200);
  lVar6 = (long)p->vObjs->nSize;
  if (lVar6 < 1) {
    local_350 = 0.0;
  }
  else {
    ppvVar3 = p->vObjs->pArray;
    lVar7 = 0;
    local_350 = 0.0;
    uVar8 = 0;
    do {
      plVar4 = (long *)ppvVar3[lVar7];
      if ((((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) &&
          (*(int *)((long)plVar4 + 0x1c) != 0)) &&
         (((*(int *)((long)plVar4 + 0x1c) != 1 || (*(int *)(*plVar4 + 4) != 4)) || (plVar4[7] != 0))
         )) {
        iVar1 = (int)plVar4[2];
        if (((long)iVar1 < 0) || (vGates->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = vGates->pArray[iVar1];
        if (((long)iVar1 < 0) || ((pLib->vCells).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar5 = (pLib->vCells).pArray[iVar1];
        lVar10 = (long)*(int *)((long)pvVar5 + 0x68);
        if (0x3f < lVar10) {
          __assert_fail("pCell->Order < ABC_SCL_MAX_SIZE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0x89,"void Abc_SclManPrintGateSizes(SC_Lib *, Abc_Ntk_t *, Vec_Int_t *)");
        }
        local_338[lVar10] = local_338[lVar10] + 1;
        dVar11 = (double)*(float *)((long)pvVar5 + 0x18);
        local_238[lVar10] = local_238[lVar10] + dVar11;
        local_350 = local_350 + dVar11;
        uVar8 = uVar8 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  printf("Total gates = %d.  Total area = %.1f\n",local_350,(ulong)uVar8);
  uVar9 = 0;
  do {
    uVar2 = local_338[uVar9];
    if (uVar2 != 0) {
      printf("Cell size = %d.  ",uVar9 & 0xffffffff);
      printf("Count = %6d  ",(ulong)uVar2);
      printf("(%5.1f %%)   ",((double)(int)uVar2 * 100.0) / (double)(int)uVar8);
      dVar11 = local_238[uVar9];
      printf("Area = %12.1f  ");
      printf("(%5.1f %%)  ",(dVar11 * 100.0) / local_350);
      putchar(10);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x40);
  return;
}

Assistant:

void Abc_SclManPrintGateSizes( SC_Lib * pLib, Abc_Ntk_t * p, Vec_Int_t * vGates )
{
    Abc_Obj_t * pObj;
    SC_Cell * pCell;
    int i, nGates = 0, Counters[ABC_SCL_MAX_SIZE] = {0};
    double TotArea = 0, Areas[ABC_SCL_MAX_SIZE] = {0};
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        pCell = SC_LibCell( pLib, Vec_IntEntry(vGates, Abc_ObjId(pObj)) );
        assert( pCell->Order < ABC_SCL_MAX_SIZE );
        Counters[pCell->Order]++;
        Areas[pCell->Order] += pCell->area;
        TotArea += pCell->area;
        nGates++;
    }
    printf( "Total gates = %d.  Total area = %.1f\n", nGates, TotArea );
    for ( i = 0; i < ABC_SCL_MAX_SIZE; i++ )
    {
        if ( Counters[i] == 0 )
            continue;
        printf( "Cell size = %d.  ", i );
        printf( "Count = %6d  ",     Counters[i] );
        printf( "(%5.1f %%)   ",     100.0 * Counters[i] / nGates );
        printf( "Area = %12.1f  ",   Areas[i] );
        printf( "(%5.1f %%)  ",      100.0 * Areas[i] / TotArea );
        printf( "\n" );
    }
}